

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

bool __thiscall QTextDocumentPrivate::split(QTextDocumentPrivate *this,int pos)

{
  quint32 qVar1;
  QTextFragmentData *pQVar2;
  uint node;
  uint uVar3;
  FragmentMap *this_00;
  int new_size;
  bool bVar4;
  
  this_00 = &this->fragments;
  bVar4 = false;
  node = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,pos,0);
  if (node != 0) {
    bVar4 = false;
    uVar3 = QFragmentMapData<QTextFragmentData>::position(&this_00->data,node,0);
    new_size = pos - uVar3;
    if (new_size != 0) {
      qVar1 = (this_00->data).field_0.fragments[node].super_QFragment<1>.size_array[0];
      QFragmentMapData<QTextFragmentData>::setSize(&this_00->data,node,new_size,0);
      uVar3 = QFragmentMapData<QTextFragmentData>::insert_single
                        (&this_00->data,pos,qVar1 - new_size);
      pQVar2 = (this_00->data).field_0.fragments;
      pQVar2[uVar3].stringPosition = new_size + pQVar2[node].stringPosition;
      pQVar2[uVar3].format = pQVar2[node].format;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool QTextDocumentPrivate::split(int pos)
{
    uint x = fragments.findNode(pos);
    if (x) {
        int k = fragments.position(x);
//          qDebug("found fragment with key %d, size_left=%d, size=%d to split at %d",
//                k, (*it)->size_left[0], (*it)->size_array[0], pos);
        if (k != pos) {
            Q_ASSERT(k <= pos);
            // need to resize the first fragment and add a new one
            QTextFragmentData *X = fragments.fragment(x);
            int oldsize = X->size_array[0];
            fragments.setSize(x, pos-k);
            uint n = fragments.insert_single(pos, oldsize-(pos-k));
            X = fragments.fragment(x);
            QTextFragmentData *N = fragments.fragment(n);
            N->stringPosition = X->stringPosition + pos-k;
            N->format = X->format;
            return true;
        }
    }
    return false;
}